

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_extents_dirty_dalloc
               (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent)

{
  uint uVar1;
  ssize_t sVar2;
  long in_RSI;
  long in_RDI;
  tsd_t *tsd;
  background_thread_info_t *info;
  uint8_t state;
  uint arena_ind;
  _Bool result_1;
  _Bool result;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  extents_t *in_stack_ffffffffffffff00;
  extent_hooks_t **in_stack_ffffffffffffff08;
  arena_t *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  witness_tsdn_t *local_a0;
  
  if (in_RDI == 0) {
    local_a0 = (witness_tsdn_t *)0x0;
  }
  else {
    local_a0 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_assert_depth_to_rank(local_a0,0xc,0);
  extents_dalloc((tsdn_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (extent_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  sVar2 = arena_dirty_decay_ms_get((arena_t *)0x112073);
  if (sVar2 == 0) {
    arena_decay_dirty((tsdn_t *)in_stack_ffffffffffffff00,
                      (arena_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),false
                      ,false);
  }
  else if (((background_thread_enabled_state.repr & 1U) != 0) &&
          (uVar1 = arena_ind_get((arena_t *)&UNK_001121ca),
          (background_thread_info[(ulong)uVar1 % max_background_threads].indefinite_sleep.repr & 1U)
          != 0)) {
    func_0x0010e7b0(in_RDI,in_RSI,in_RSI + 0x6320,0);
  }
  return;
}

Assistant:

void
arena_extents_dirty_dalloc(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extents_dalloc(tsdn, arena, r_extent_hooks, &arena->extents_dirty,
	    extent);
	if (arena_dirty_decay_ms_get(arena) == 0) {
		arena_decay_dirty(tsdn, arena, false, true);
	} else {
		arena_background_thread_inactivity_check(tsdn, arena, false);
	}
}